

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnswitch::SpecializeLoop
          (LoopUnswitch *this,Loop *loop,Instruction *to_version_insn,Instruction *cst_value)

{
  Instruction *this_00;
  initializer_list<unsigned_int> init_list;
  uint32_t index;
  _Invoker_type this_01;
  bool bVar1;
  reference ppVar2;
  uint32_t local_11c;
  iterator local_118;
  undefined8 local_110;
  SmallVector<unsigned_int,_2UL> local_108;
  uint32_t local_dc;
  Instruction *pIStack_d8;
  uint32_t operand_index;
  Instruction *inst;
  pair<spvtools::opt::Instruction_*,_unsigned_int> use;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  *__range3;
  function<bool_(unsigned_int)> *local_a0;
  LoopUnswitch *local_98;
  function<void_(spvtools::opt::Instruction_*,_unsigned_int)> local_90;
  undefined1 local_70 [8];
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  use_list;
  undefined1 local_50 [8];
  function<bool_(unsigned_int)> ignore_node;
  DefUseManager *def_use_mgr;
  Instruction *cst_value_local;
  Instruction *to_version_insn_local;
  Loop *loop_local;
  LoopUnswitch *this_local;
  
  ignore_node._M_invoker = (_Invoker_type)IRContext::get_def_use_mgr(this->context_);
  std::function<bool_(unsigned_int)>::function((function<bool_(unsigned_int)> *)local_50);
  use_list.
  super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)loop;
  std::function<bool(unsigned_int)>::operator=
            ((function<bool(unsigned_int)> *)local_50,
             (anon_class_8_1_898e73a2 *)
             &use_list.
              super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  ::vector((vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
            *)local_70);
  this_01 = ignore_node._M_invoker;
  __range3 = (vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
              *)local_70;
  local_a0 = (function<bool_(unsigned_int)> *)local_50;
  local_98 = this;
  std::function<void(spvtools::opt::Instruction*,unsigned_int)>::
  function<spvtools::opt::(anonymous_namespace)::LoopUnswitch::SpecializeLoop(spvtools::opt::Loop*,spvtools::opt::Instruction*,spvtools::opt::Instruction*)::_lambda(spvtools::opt::Instruction*,unsigned_int)_1_,void>
            ((function<void(spvtools::opt::Instruction*,unsigned_int)> *)&local_90,
             (anon_class_24_3_41df2ffa *)&__range3);
  analysis::DefUseManager::ForEachUse((DefUseManager *)this_01,to_version_insn,&local_90);
  std::function<void_(spvtools::opt::Instruction_*,_unsigned_int)>::~function(&local_90);
  __end3 = std::
           vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
           ::begin((vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                    *)local_70);
  use._8_8_ = std::
              vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
              ::end((vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                     *)local_70);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>_>
                                *)&use.second);
    if (!bVar1) {
      std::
      vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
      ::~vector((vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                 *)local_70);
      std::function<bool_(unsigned_int)>::~function((function<bool_(unsigned_int)> *)local_50);
      return;
    }
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>_>
             ::operator*(&__end3);
    this_00 = ppVar2->first;
    use.first = *(Instruction **)&ppVar2->second;
    index = (uint32_t)use.first;
    local_dc = (uint32_t)use.first;
    pIStack_d8 = this_00;
    inst = this_00;
    if (cst_value == (Instruction *)0x0) break;
    local_11c = opt::Instruction::result_id(cst_value);
    local_118 = &local_11c;
    local_110 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_118;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_108,init_list);
    opt::Instruction::SetOperand(this_00,index,&local_108);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_108);
    analysis::DefUseManager::AnalyzeInstUse((DefUseManager *)ignore_node._M_invoker,pIStack_d8);
    __gnu_cxx::
    __normal_iterator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>_>
    ::operator++(&__end3);
  }
  __assert_fail("cst_value && \"We do not have a value to use.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                ,0x1e3,
                "void spvtools::opt::(anonymous namespace)::LoopUnswitch::SpecializeLoop(Loop *, Instruction *, Instruction *)"
               );
}

Assistant:

void SpecializeLoop(Loop* loop, Instruction* to_version_insn,
                      Instruction* cst_value) {
    analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

    std::function<bool(uint32_t)> ignore_node;
    ignore_node = [loop](uint32_t bb_id) { return !loop->IsInsideLoop(bb_id); };

    std::vector<std::pair<Instruction*, uint32_t>> use_list;
    def_use_mgr->ForEachUse(to_version_insn,
                            [&use_list, &ignore_node, this](
                                Instruction* inst, uint32_t operand_index) {
                              BasicBlock* bb = context_->get_instr_block(inst);

                              if (!bb || ignore_node(bb->id())) {
                                // Out of the loop, the specialization does not
                                // apply any more.
                                return;
                              }
                              use_list.emplace_back(inst, operand_index);
                            });

    // First pass: inject the specialized value into the loop (and only the
    // loop).
    for (auto use : use_list) {
      Instruction* inst = use.first;
      uint32_t operand_index = use.second;

      // To also handle switch, cst_value can be nullptr: this case
      // means that we are looking to branch to the default target of
      // the switch. We don't actually know its value so we don't touch
      // it if it not a switch.
      assert(cst_value && "We do not have a value to use.");
      inst->SetOperand(operand_index, {cst_value->result_id()});
      def_use_mgr->AnalyzeInstUse(inst);
    }
  }